

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Minisat::SimpSolver::extendModel(SimpSolver *this)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  undefined8 in_RAX;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  undefined8 uStack_38;
  
  uVar4 = (this->elimclauses).sz - 1;
  uStack_38 = in_RAX;
  do {
    if ((int)uVar4 < 1) {
      return;
    }
    uVar6 = (ulong)uVar4;
    uVar4 = (this->elimclauses).data[uVar6];
    uVar5 = 1;
    if ((int)uVar4 < 1) {
      uVar5 = uVar4;
    }
    lVar7 = uVar6 << 0x20;
    for (; lVar7 = lVar7 + -0x100000000, 1 < (int)uVar4; uVar4 = uVar4 - 1) {
      uVar1 = (this->elimclauses).data[uVar6 - 1];
      uStack_38 = CONCAT17((byte)uVar1 & 1 ^ (this->super_Solver).model.data[(int)uVar1 >> 1].value,
                           (undefined7)uStack_38);
      bVar3 = lbool::operator!=((lbool *)((long)&uStack_38 + 7),(lbool)0x1);
      if (bVar3) goto LAB_00126b40;
      uVar6 = uVar6 - 1;
    }
    iVar2 = *(int *)((long)(this->elimclauses).data + (lVar7 >> 0x1e));
    (this->super_Solver).model.data[iVar2 >> 1].value = (byte)iVar2 & 1;
    uVar4 = uVar5;
LAB_00126b40:
    uVar4 = ~uVar4 + (int)uVar6;
  } while( true );
}

Assistant:

void SimpSolver::extendModel()
{
    int i, j;
    Lit x;

    for (i = elimclauses.size() - 1; i > 0; i -= j) {
        for (j = elimclauses[i--]; j > 1; j--, i--)
            if (modelValue(toLit(elimclauses[i])) != l_False) goto next;

        x = toLit(elimclauses[i]);
        model[var(x)] = lbool(!sign(x));
    next:;
    }
}